

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configreader.cpp
# Opt level: O2

bool __thiscall ConfigReader::isSpecialIdentChar(ConfigReader *this,char c)

{
  return (c == '.' || (c == '\\' || c == '/')) || ((c & 0xfdU) == 0x3c || (c + 0xa5U & 0xfd) == 0);
}

Assistant:

bool ConfigReader::isSpecialIdentChar(char c) const
{
    if ((c == '[') || (c == ']') || 
        (c == '<') || (c == '>') || 
        (c == '/') || (c == '\\') ||
        (c == '.'))
    {
        return true;
    }
    return false;
}